

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::writeDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,
               VkDescriptorPool pool,VkBufferView viewA,VkBufferView viewB,
               VkDescriptorSet descriptorSet,Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  undefined7 in_stack_00000031;
  VkBufferView texelBufferInfos [2];
  undefined1 local_e8 [12];
  VkDescriptorType VStack_dc;
  VkDevice local_d8;
  VkAllocationCallbacks *pVStack_d0;
  VkDescriptorUpdateTemplateEntryKHR *local_c8;
  iterator iStack_c0;
  VkDescriptorUpdateTemplateEntryKHR *local_b8;
  Move<vk::Handle<(vk::HandleType)32>_> local_a8;
  Handle<(vk::HandleType)12> local_88;
  Handle<(vk::HandleType)12> local_80;
  VkDescriptorUpdateTemplateCreateInfoKHR local_78;
  
  local_78.pipelineLayout.m_internal = CONCAT71(in_stack_00000031,withPush);
  local_80.m_internal = viewA.m_internal;
  local_b8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_c8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  iStack_c0._M_current = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_78.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_78.pNext = (void *)0x0;
  local_78.flags = 0;
  local_78.descriptorUpdateEntryCount = 0;
  local_78.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_78.templateType = (VkDescriptorUpdateTemplateTypeKHR)(byte)updateRegistry;
  local_78.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_78.set = 0;
  local_88.m_internal = pool.m_internal;
  local_78.descriptorSetLayout.m_internal = layout.m_internal;
  BindingModel::(anonymous_namespace)::RawUpdateRegistry::
  addWriteObject<vk::Handle<(vk::HandleType)12>>((RawUpdateRegistry *)updateTemplate,&local_88);
  BindingModel::(anonymous_namespace)::RawUpdateRegistry::
  addWriteObject<vk::Handle<(vk::HandleType)12>>((RawUpdateRegistry *)updateTemplate,&local_80);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_d8 = (VkDevice)
               ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
               m_allocator)->pUserData;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    VStack_dc = descriptorType;
    local_e8._8_4_ = 1;
    pVStack_d0 = (VkAllocationCallbacks *)0x0;
    if (iStack_c0._M_current == local_b8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_c8,iStack_c0,(VkDescriptorUpdateTemplateEntryKHR *)local_e8);
      goto LAB_00555162;
    }
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_d8 = (VkDevice)
               ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
               m_allocator)->pUserData;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    VStack_dc = descriptorType;
    local_e8._8_4_ = 1;
    pVStack_d0 = (VkAllocationCallbacks *)0x0;
    if (iStack_c0._M_current == local_b8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_c8,iStack_c0,(VkDescriptorUpdateTemplateEntryKHR *)local_e8);
    }
    else {
      (iStack_c0._M_current)->offset = (deUintptr)local_d8;
      (iStack_c0._M_current)->stride = 0;
      (iStack_c0._M_current)->dstBinding = 0;
      (iStack_c0._M_current)->dstArrayElement = 0;
      (iStack_c0._M_current)->descriptorCount = 1;
      (iStack_c0._M_current)->descriptorType = descriptorType;
      iStack_c0._M_current = iStack_c0._M_current + 1;
    }
    local_d8 = (VkDevice)
               ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
               m_allocator)->pfnAllocation;
    local_e8._0_4_ = 1;
    local_e8._4_4_ = 0;
    local_e8._8_4_ = 1;
    pVStack_d0 = (VkAllocationCallbacks *)0x0;
    if (iStack_c0._M_current == local_b8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_c8,iStack_c0,(VkDescriptorUpdateTemplateEntryKHR *)local_e8);
      goto LAB_00555162;
    }
  }
  else {
    if (shaderInterface != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_00555162;
    local_d8 = (VkDevice)
               ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
               m_allocator)->pUserData;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    VStack_dc = descriptorType;
    local_e8._8_4_ = 2;
    pVStack_d0 = (VkAllocationCallbacks *)0x8;
    if (iStack_c0._M_current == local_b8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_c8,iStack_c0,(VkDescriptorUpdateTemplateEntryKHR *)local_e8);
      goto LAB_00555162;
    }
  }
  (iStack_c0._M_current)->offset = (deUintptr)local_d8;
  (iStack_c0._M_current)->stride = (deUintptr)pVStack_d0;
  (iStack_c0._M_current)->dstBinding = local_e8._0_4_;
  (iStack_c0._M_current)->dstArrayElement = local_e8._4_4_;
  (iStack_c0._M_current)->descriptorCount = local_e8._8_4_;
  (iStack_c0._M_current)->descriptorType = VStack_dc;
  iStack_c0._M_current = iStack_c0._M_current + 1;
LAB_00555162:
  local_78.pDescriptorUpdateEntries = local_c8;
  local_78.descriptorUpdateEntryCount =
       (deUint32)((ulong)((long)iStack_c0._M_current - (long)local_c8) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_a8,vki,device,&local_78,(VkAllocationCallbacks *)0x0);
  local_d8 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device;
  pVStack_d0 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator;
  local_e8._0_8_ = local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal;
  stack0xffffffffffffff20 =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*descriptorSet.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)32>_> *)(descriptorSet.m_internal + 8),
               (VkDescriptorUpdateTemplateKHR)*descriptorSet.m_internal);
  }
  *(VkDevice *)(descriptorSet.m_internal + 0x10) = local_d8;
  *(VkAllocationCallbacks **)(descriptorSet.m_internal + 0x18) = pVStack_d0;
  *(undefined4 *)descriptorSet.m_internal = local_e8._0_4_;
  *(undefined4 *)(descriptorSet.m_internal + 4) = local_e8._4_4_;
  *(undefined4 *)(descriptorSet.m_internal + 8) = local_e8._8_4_;
  *(VkDescriptorType *)(descriptorSet.m_internal + 0xc) = VStack_dc;
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter,
               (VkDescriptorUpdateTemplateKHR)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal);
  }
  if ((byte)updateRegistry == 0) {
    (*vki->_vptr_DeviceInterface[0x92])
              (vki,device,viewB.m_internal,*(undefined8 *)descriptorSet.m_internal,
               (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.
               m_internal);
  }
  if (local_c8 != (VkDescriptorUpdateTemplateEntryKHR *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  return;
}

Assistant:

void TexelBufferRenderInstance::writeDescriptorSetWithTemplate (const vk::DeviceInterface&						vki,
																vk::VkDevice									device,
																vk::VkDescriptorType							descriptorType,
																ShaderInputInterface							shaderInterface,
																vk::VkDescriptorSetLayout						layout,
																vk::VkDescriptorPool							pool,
																vk::VkBufferView								viewA,
																vk::VkBufferView								viewB,
																vk::VkDescriptorSet								descriptorSet,
																vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
																RawUpdateRegistry&								updateRegistry,
																bool											withPush,
																vk::VkPipelineLayout							pipelineLayout)
{
	DE_UNREF(pool);
	const vk::VkBufferView									texelBufferInfos[2]	=
	{
		viewA,
		viewB,
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	updateRegistry.addWriteObject(texelBufferInfos[0]);
	updateRegistry.addWriteObject(texelBufferInfos[1]);

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0, 0, 2, descriptorType, updateRegistry.getWriteObjectOffset(0), sizeof(texelBufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	updateTemplate									= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}